

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

void __thiscall YAML::Stream::AdvanceCurrent(Stream *this)

{
  if ((this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    std::deque<char,_std::allocator<char>_>::pop_front(&this->m_readahead);
    (this->m_mark).pos = (this->m_mark).pos + 1;
  }
  ReadAheadTo(this,0);
  return;
}

Assistant:

void Stream::AdvanceCurrent() {
  if (!m_readahead.empty()) {
    m_readahead.pop_front();
    m_mark.pos++;
  }

  ReadAheadTo(0);
}